

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.hpp
# Opt level: O1

ArgIface * __thiscall Args::Arg::findArgument(Arg *this,String *name)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  long *local_68;
  size_t local_60;
  long local_58 [2];
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  bVar3 = false;
  lVar2 = std::__cxx11::string::find((char *)name,0x144ce5,0);
  if (lVar2 == 0) {
    std::__cxx11::string::substr((ulong)&local_48,(ulong)name);
    if (local_40 == (this->m_name)._M_string_length) {
      if (local_40 == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp(local_48,(this->m_name)._M_dataplus._M_p,local_40);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
  }
  if ((lVar2 == 0) && (local_48 != local_38)) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (!bVar3) {
    lVar2 = std::__cxx11::string::find((char *)name,0x144ce5,0);
    if ((lVar2 == 0) || (lVar2 = std::__cxx11::string::find((char)name,0x2d), lVar2 != 0)) {
      bVar3 = false;
    }
    else {
      bVar3 = true;
    }
    if ((bVar3) &&
       (std::__cxx11::string::substr((ulong)&local_68,(ulong)name),
       local_60 == (this->m_flag)._M_string_length)) {
      if (local_60 != 0) {
        iVar1 = bcmp(local_68,(this->m_flag)._M_dataplus._M_p,local_60);
        if (iVar1 != 0) {
          this = (Arg *)0x0;
        }
      }
    }
    else {
      this = (Arg *)0x0;
    }
    if ((bVar3) && (local_68 != local_58)) {
      operator_delete(local_68,local_58[0] + 1);
    }
  }
  return &this->super_ArgIface;
}

Assistant:

ArgIface * findArgument(
		/*!
			Name of the argument. Can be for example "-t" or
			"--timeout".
		*/
		const String & name ) override
	{
		if( details::isArgument( name ) && name.substr( 2 ) == m_name )
			return this;
		else if( details::isFlag( name ) && name.substr( 1 ) == m_flag )
			return this;
		else
			return nullptr;
	}